

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O2

void __thiscall btSoftBody::CJoint::Solve(CJoint *this,btScalar dt,btScalar sor)

{
  Body *this_00;
  Body *this_01;
  btVector3 *rpos;
  Cluster *pCVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  Impulse *__return_storage_ptr__;
  int iVar4;
  int iVar5;
  btScalar bVar6;
  undefined4 extraout_XMM0_Dc;
  float extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  float extraout_XMM0_Dd_00;
  float fVar7;
  float in_XMM1_Dc;
  float in_XMM1_Dd;
  float fVar8;
  float fVar9;
  btVector3 bVar10;
  btVector3 bVar11;
  btScalar rvac;
  float local_dc;
  Impulse local_d8;
  undefined1 local_a8 [8];
  float fStack_a0;
  float fStack_9c;
  undefined1 local_98 [8];
  float fStack_90;
  float fStack_8c;
  btScalar local_88;
  Impulse local_78;
  Impulse local_54;
  
  this_00 = (this->super_Joint).m_bodies;
  rpos = this->m_rpos;
  local_88 = sor;
  bVar10 = Body::velocity(this_00,rpos);
  fStack_a0 = (float)extraout_XMM0_Dc;
  local_a8 = (undefined1  [8])bVar10.m_floats._0_8_;
  fStack_9c = (float)extraout_XMM0_Dd;
  fStack_90 = in_XMM1_Dc;
  local_98 = (undefined1  [8])bVar10.m_floats._8_8_;
  fStack_8c = in_XMM1_Dd;
  this_01 = (this->super_Joint).m_bodies + 1;
  bVar10 = Body::velocity(this_01,this->m_rpos + 1);
  local_a8._0_4_ = (float)local_a8._0_4_ - bVar10.m_floats[0];
  local_a8._4_4_ = (float)local_a8._4_4_ - bVar10.m_floats[1];
  local_98._0_4_ = (float)local_98._0_4_ - bVar10.m_floats[2];
  fStack_a0 = fStack_a0 - extraout_XMM0_Dc_00;
  fStack_9c = fStack_9c - extraout_XMM0_Dd_00;
  local_98._4_4_ = (float)local_98._4_4_ - bVar10.m_floats[3];
  fStack_90 = fStack_90 - in_XMM1_Dc;
  fStack_8c = fStack_8c - in_XMM1_Dd;
  local_dc = (this->m_normal).m_floats[2] * (float)local_98._0_4_ +
             (this->m_normal).m_floats[0] * (float)local_a8._0_4_ +
             (float)local_a8._4_4_ * (this->m_normal).m_floats[1];
  local_d8._32_1_ = 1;
  local_d8.m_drift.m_floats[0] = 0.0;
  local_d8.m_drift.m_floats[1] = 0.0;
  local_d8.m_drift.m_floats[2] = 0.0;
  local_d8.m_drift.m_floats[3] = 0.0;
  local_d8.m_velocity.m_floats = *&(this->super_Joint).m_drift.m_floats;
  if (local_dc < 0.0) {
    bVar11 = operator*(&this->m_normal,&local_dc);
    bVar10.m_floats = local_d8.m_velocity.m_floats;
    fVar7 = this->m_friction;
    fVar8 = local_d8.m_velocity.m_floats[0];
    local_d8.m_velocity.m_floats[1] =
         local_d8.m_velocity.m_floats[1] +
         fVar7 * ((float)local_a8._4_4_ - bVar11.m_floats[1]) + bVar11.m_floats[1];
    local_d8.m_velocity.m_floats[0] =
         fVar8 + fVar7 * ((float)local_a8._0_4_ - bVar11.m_floats[0]) + bVar11.m_floats[0];
    local_d8.m_velocity.m_floats[2] = bVar10.m_floats[2];
    local_d8.m_velocity.m_floats[3] = bVar10.m_floats[3];
    local_d8.m_velocity.m_floats[2] =
         ((float)local_98._0_4_ - bVar11.m_floats[2]) * fVar7 + bVar11.m_floats[2] +
         local_d8.m_velocity.m_floats[2];
  }
  bVar10 = operator*(&(this->super_Joint).m_massmatrix,&local_d8.m_velocity);
  fVar7 = bVar10.m_floats[2] * local_88;
  fVar8 = local_88 * bVar10.m_floats[0];
  fVar9 = local_88 * bVar10.m_floats[1];
  local_d8.m_velocity.m_floats[1] = fVar9;
  local_d8.m_velocity.m_floats[0] = fVar8;
  local_d8.m_velocity.m_floats[2] = fVar7;
  local_d8.m_velocity.m_floats[3] = 0.0;
  pCVar1 = (this->super_Joint).m_bodies[0].m_soft;
  if (pCVar1 == (this->super_Joint).m_bodies[1].m_soft) {
    iVar4 = -(uint)!NAN(fVar8);
    iVar5 = -(uint)!NAN(fVar9);
    auVar2._4_4_ = iVar4;
    auVar2._0_4_ = iVar4;
    auVar2._8_4_ = iVar5;
    auVar2._12_4_ = iVar5;
    uVar3 = movmskpd((int)pCVar1,auVar2);
    if ((uVar3 & 1) == 0) {
      return;
    }
    if ((byte)((byte)uVar3 >> 1) == 0) {
      return;
    }
    if (NAN(fVar7)) {
      return;
    }
    if ((local_d8._32_1_ & 1) == 0) {
      return;
    }
    bVar6 = btVector3::length(&local_d8.m_velocity);
    if (bVar6 < this_00->m_soft->m_maxSelfCollisionImpulse) {
      return;
    }
    Impulse::operator-(&local_54,&local_d8);
    Impulse::operator*(&local_78,&local_54,this_00->m_soft->m_selfCollisionImpulseFactor);
    Body::applyImpulse(this_00,&local_78,rpos);
    __return_storage_ptr__ = &local_78;
    Impulse::operator*(__return_storage_ptr__,&local_d8,
                       this_00->m_soft->m_selfCollisionImpulseFactor);
  }
  else {
    __return_storage_ptr__ = &local_d8;
    Impulse::operator-(&local_78,__return_storage_ptr__);
    Body::applyImpulse(this_00,&local_78,rpos);
  }
  Body::applyImpulse(this_01,__return_storage_ptr__,this->m_rpos + 1);
  return;
}

Assistant:

void				btSoftBody::CJoint::Solve(btScalar dt,btScalar sor)
{
	const btVector3		va=m_bodies[0].velocity(m_rpos[0]);
	const btVector3		vb=m_bodies[1].velocity(m_rpos[1]);
	const btVector3		vrel=va-vb;
	const btScalar		rvac=btDot(vrel,m_normal);
	btSoftBody::Impulse	impulse;
	impulse.m_asVelocity	=	1;
	impulse.m_velocity		=	m_drift;
	if(rvac<0)
	{
		const btVector3	iv=m_normal*rvac;
		const btVector3	fv=vrel-iv;
		impulse.m_velocity	+=	iv+fv*m_friction;
	}
	impulse.m_velocity=m_massmatrix*impulse.m_velocity*sor;
	
	if (m_bodies[0].m_soft==m_bodies[1].m_soft)
	{
		if ((impulse.m_velocity.getX() ==impulse.m_velocity.getX())&&(impulse.m_velocity.getY() ==impulse.m_velocity.getY())&&
			(impulse.m_velocity.getZ() ==impulse.m_velocity.getZ()))
		{
			if (impulse.m_asVelocity)
			{
				if (impulse.m_velocity.length() <m_bodies[0].m_soft->m_maxSelfCollisionImpulse)
				{
					
				} else
				{
					m_bodies[0].applyImpulse(-impulse*m_bodies[0].m_soft->m_selfCollisionImpulseFactor,m_rpos[0]);
					m_bodies[1].applyImpulse( impulse*m_bodies[0].m_soft->m_selfCollisionImpulseFactor,m_rpos[1]);
				}
			}
		}
	} else
	{
		m_bodies[0].applyImpulse(-impulse,m_rpos[0]);
		m_bodies[1].applyImpulse( impulse,m_rpos[1]);
	}
}